

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2mecab.c
# Opt level: O0

void text2mecab(char *output,char *input)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  long in_RDI;
  int e;
  int s;
  int index;
  char *str;
  int length;
  int j;
  int i;
  int local_34;
  int local_30;
  int local_2c;
  int local_18;
  int local_14;
  
  sVar1 = strlen(in_RSI);
  local_2c = 0;
  local_34 = -1;
  local_30 = 0;
  do {
    while( true ) {
      while( true ) {
        if ((int)sVar1 <= local_30) {
          *(undefined1 *)(in_RDI + local_2c) = 0;
          return;
        }
        pcVar2 = in_RSI + local_30;
        local_14 = 0;
        while ((text2mecab_conv_list[local_14] != (char *)0x0 &&
               (local_34 = strtopcmp(pcVar2,text2mecab_conv_list[local_14]), local_34 == -1))) {
          local_14 = local_14 + 2;
        }
        if (local_34 == -1) break;
        local_30 = local_34 + local_30;
        pcVar2 = text2mecab_conv_list[local_14 + 1];
        for (local_18 = 0; pcVar2[local_18] != '\0'; local_18 = local_18 + 1) {
          *(char *)(in_RDI + local_2c) = pcVar2[local_18];
          local_2c = local_2c + 1;
        }
      }
      if ((*pcVar2 < '\0') || ('\x7f' < *pcVar2)) break;
      local_30 = local_30 + 1;
    }
    local_34 = -1;
    for (local_18 = 0; '\0' < text2mecab_kanji_range[local_18]; local_18 = local_18 + 3) {
      if ((text2mecab_kanji_range[local_18 + 1] <= *pcVar2) &&
         (*pcVar2 <= text2mecab_kanji_range[local_18 + 2])) {
        local_34 = (int)text2mecab_kanji_range[local_18];
        break;
      }
    }
    if (local_34 < 1) {
      fprintf(_stderr,"WARNING: text2mecab() in text2mecab.c: Wrong character.\n");
      local_30 = local_30 + 1;
    }
    else {
      for (local_18 = 0; local_18 < local_34; local_18 = local_18 + 1) {
        *(char *)(in_RDI + local_2c) = in_RSI[local_30];
        local_30 = local_30 + 1;
        local_2c = local_2c + 1;
      }
    }
  } while( true );
}

Assistant:

void text2mecab(char *output, const char *input)
{
   int i, j;
   const int length = strlen(input);
   const char *str;
   int index = 0;
   int s, e = -1;

   for (s = 0; s < length;) {
      str = &input[s];
      /* search */
      for (i = 0; text2mecab_conv_list[i] != NULL; i += 2) {
         e = strtopcmp(str, text2mecab_conv_list[i]);
         if (e != -1)
            break;
      }
      if (e != -1) {
         /* convert */
         s += e;
         str = text2mecab_conv_list[i + 1];
         for (j = 0; str[j] != '\0'; j++)
            output[index++] = str[j];
      } else if (text2mecab_control_range[0] <= str[0] && str[0] <= text2mecab_control_range[1]) {
         /* control character */
         s++;
      } else {
         /* multi byte character */
         e = -1;
         for (j = 0; text2mecab_kanji_range[j] > 0; j += 3) {
            if (text2mecab_kanji_range[j + 1] <= str[0] && text2mecab_kanji_range[j + 2] >= str[0]) {
               e = text2mecab_kanji_range[j];
               break;
            }
         }
         if (e > 0) {
            for (j = 0; j < e; j++)
               output[index++] = input[s++];
         } else {
            /* unknown */
            fprintf(stderr, "WARNING: text2mecab() in text2mecab.c: Wrong character.\n");
            s++;
         }
      }
   }
   output[index] = '\0';
}